

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O0

mpt_metatype * parseClone(mpt_metatype *mt)

{
  mpt_metatype *pmVar1;
  _mpt_vptr_metatype *local_20;
  char *ptr;
  mpt_parseIterator *it;
  mpt_metatype *mt_local;
  
  if (mt[8]._vptr == (_mpt_vptr_metatype *)0x0) {
    local_20 = mt[6]._vptr;
  }
  else {
    local_20 = mt[8]._vptr;
  }
  pmVar1 = mpt_iterator_string((char *)local_20,(char *)(mt + 10));
  return pmVar1;
}

Assistant:

static MPT_INTERFACE(metatype) *parseClone(const MPT_INTERFACE(metatype) *mt)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, mt, _mt);
	const char *ptr;
	
	if (it->restore) {
		ptr = it->restore;
	} else {
		ptr = it->val;
	}
	return mpt_iterator_string(ptr, (char *) (it + 1));
}